

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_crt.c
# Opt level: O1

int mbedtls_x509_crt_verify_with_profile
              (mbedtls_x509_crt *crt,mbedtls_x509_crt *trust_ca,mbedtls_x509_crl *ca_crl,
              mbedtls_x509_crt_profile *profile,char *cn,uint32_t *flags,
              _func_int_void_ptr_mbedtls_x509_crt_ptr_int_uint32_t_ptr *f_vrfy,void *p_vrfy)

{
  byte *pbVar1;
  mbedtls_pk_context *pk;
  ulong uVar2;
  mbedtls_md_type_t md_alg;
  short *psVar3;
  void *options;
  uint uVar4;
  byte bVar5;
  int iVar6;
  mbedtls_pk_type_t mVar7;
  int iVar8;
  size_t sVar9;
  mbedtls_x509_crt *pmVar10;
  mbedtls_x509_crt *pmVar11;
  mbedtls_md_info_t *md_info;
  mbedtls_x509_buf *name;
  size_t path_cnt;
  uint uVar12;
  uint uVar13;
  mbedtls_asn1_named_data *pmVar14;
  uint32_t *puVar15;
  mbedtls_x509_crl *crl;
  bool bVar16;
  uint32_t *local_160;
  size_t local_140;
  uint32_t cur_flags;
  x509_crt_verify_chain_item ver_chain [10];
  
  *flags = 0;
  memset(ver_chain,0,0xa0);
  if (profile != (mbedtls_x509_crt_profile *)0x0) {
    if (cn != (char *)0x0) {
      sVar9 = strlen(cn);
      if ((crt->ext_types & 0x20) == 0) {
        pmVar14 = &crt->subject;
        do {
          if ((((pmVar14->oid).len == 3) &&
              (psVar3 = (short *)(pmVar14->oid).p, (char)psVar3[1] == '\x03' && *psVar3 == 0x455))
             && (iVar6 = x509_crt_check_cn(&pmVar14->val,cn,sVar9), iVar6 == 0)) goto LAB_00122d4a;
          pmVar14 = pmVar14->next;
        } while (pmVar14 != (mbedtls_asn1_named_data *)0x0);
      }
      else {
        name = &(crt->subject_alt_names).buf;
        do {
          iVar6 = x509_crt_check_cn(name,cn,sVar9);
          if (iVar6 == 0) goto LAB_00122d4a;
          name = *(mbedtls_x509_buf **)(name + 1);
        } while (name != (mbedtls_x509_buf *)0x0);
      }
      ver_chain[0].flags._0_1_ = (byte)ver_chain[0].flags | 4;
    }
LAB_00122d4a:
    mVar7 = mbedtls_pk_get_type(&crt->pk);
    if ((profile->allowed_pks >> ((byte)((char)mVar7 - 1) & 0x1f) & 1) == 0) {
      ver_chain[0].flags._1_1_ = ver_chain[0].flags._1_1_ | 0x80;
    }
    iVar6 = x509_profile_check_key(profile,&crt->pk);
    if (iVar6 != 0) {
      ver_chain[0].flags._2_1_ = ver_chain[0].flags._2_1_ | 1;
    }
    local_160 = &ver_chain[0].flags;
    local_140 = 0;
    path_cnt = 0;
    bVar16 = false;
    do {
      puVar15 = &ver_chain[path_cnt].flags;
      ver_chain[path_cnt].crt = crt;
      iVar6 = mbedtls_x509_time_is_past(&crt->valid_to);
      if (iVar6 != 0) {
        *(byte *)puVar15 = (byte)*puVar15 | 1;
      }
      iVar6 = mbedtls_x509_time_is_future(&crt->valid_from);
      if (iVar6 != 0) {
        pbVar1 = (byte *)((long)&ver_chain[path_cnt].flags + 1);
        *pbVar1 = *pbVar1 | 2;
      }
      uVar2 = path_cnt + 1;
      iVar6 = 0;
      if (bVar16) goto LAB_00123196;
      if ((profile->allowed_mds >> ((byte)((char)crt->sig_md - MBEDTLS_MD_MD2) & 0x1f) & 1) == 0) {
        pbVar1 = (byte *)((long)&ver_chain[path_cnt].flags + 1);
        *pbVar1 = *pbVar1 | 0x40;
      }
      if ((profile->allowed_pks >> ((byte)((char)crt->sig_pk - MBEDTLS_PK_RSA) & 0x1f) & 1) == 0) {
        pbVar1 = (byte *)((long)&ver_chain[path_cnt].flags + 1);
        *pbVar1 = *pbVar1 | 0x80;
      }
      if (((path_cnt == 0) && (iVar6 = x509_name_cmp(&crt->issuer,&crt->subject), iVar6 == 0)) &&
         (trust_ca != (mbedtls_x509_crt *)0x0)) {
        sVar9 = (crt->raw).len;
        pmVar11 = trust_ca;
        do {
          if ((sVar9 == (pmVar11->raw).len) &&
             (iVar6 = bcmp((crt->raw).p,(pmVar11->raw).p,sVar9), iVar6 == 0)) goto LAB_0012317e;
          pmVar11 = pmVar11->next;
        } while (pmVar11 != (mbedtls_x509_crt *)0x0);
      }
      pmVar10 = x509_crt_find_parent_in(crt,trust_ca,1,path_cnt,local_140);
      pmVar11 = pmVar10;
      if (pmVar10 == (mbedtls_x509_crt *)0x0) {
        pmVar11 = x509_crt_find_parent_in(crt,crt->next,0,path_cnt,local_140);
      }
      if (pmVar11 == (mbedtls_x509_crt *)0x0) {
        *(byte *)puVar15 = (byte)*puVar15 | 8;
LAB_0012317e:
        bVar16 = true;
        iVar6 = 0;
        goto LAB_00123196;
      }
      if (path_cnt != 0) {
        iVar6 = x509_name_cmp(&crt->issuer,&crt->subject);
        local_140 = local_140 + (iVar6 == 0);
      }
      if ((8 < uVar2) && (pmVar10 == (mbedtls_x509_crt *)0x0)) goto LAB_00123183;
      if ((pmVar10 == (mbedtls_x509_crt *)0x0) &&
         (iVar6 = x509_crt_check_signature(crt,pmVar11), iVar6 != 0)) {
        *(byte *)puVar15 = (byte)*puVar15 | 8;
      }
      pk = &pmVar11->pk;
      iVar6 = x509_profile_check_key(profile,pk);
      if (iVar6 != 0) {
        pbVar1 = (byte *)((long)&ver_chain[path_cnt].flags + 2);
        *pbVar1 = *pbVar1 | 1;
      }
      uVar13 = 0;
      for (crl = ca_crl; crl != (mbedtls_x509_crl *)0x0; crl = crl->next) {
        while (((crl->version != 0 &&
                (sVar9 = (crl->issuer_raw).len, sVar9 == (pmVar11->subject_raw).len)) &&
               (iVar6 = bcmp((crl->issuer_raw).p,(pmVar11->subject_raw).p,sVar9), iVar6 == 0))) {
          if (((pmVar11->ext_types & 4) != 0) && ((pmVar11->key_usage & 0x8003) != 2)) {
            uVar13 = uVar13 | 0x10;
            goto LAB_0012314e;
          }
          uVar12 = uVar13 | 0x20000;
          if ((profile->allowed_mds >> (crl->sig_md - MBEDTLS_MD_MD2 & 0x1f) & 1) != 0) {
            uVar12 = uVar13;
          }
          uVar4 = uVar12 | 0x40000;
          if ((profile->allowed_pks >> ((byte)((char)crl->sig_pk - MBEDTLS_PK_RSA) & 0x1f) & 1) != 0
             ) {
            uVar4 = uVar12;
          }
          md_info = mbedtls_md_info_from_type(crl->sig_md);
          iVar6 = mbedtls_md(md_info,(crl->tbs).p,(crl->tbs).len,(uchar *)&cur_flags);
          if (iVar6 != 0) {
            uVar13 = uVar4 | 0x10;
            goto LAB_0012314e;
          }
          iVar6 = x509_profile_check_key(profile,pk);
          uVar13 = uVar4 | 0x10000;
          if (iVar6 == 0) {
            uVar13 = uVar4;
          }
          md_alg = crl->sig_md;
          mVar7 = crl->sig_pk;
          options = crl->sig_opts;
          bVar5 = mbedtls_md_get_size(md_info);
          iVar6 = mbedtls_pk_verify_ext
                            (mVar7,options,pk,md_alg,(uchar *)&cur_flags,(ulong)bVar5,(crl->sig).p,
                             (crl->sig).len);
          if (iVar6 != 0) {
            uVar13 = uVar13 | 0x10;
            goto LAB_0012314e;
          }
          iVar6 = mbedtls_x509_time_is_past(&crl->next_update);
          uVar12 = uVar13 | 0x20;
          if (iVar6 == 0) {
            uVar12 = uVar13;
          }
          iVar6 = mbedtls_x509_time_is_future(&crl->this_update);
          uVar13 = uVar12 | 0x400;
          if (iVar6 == 0) {
            uVar13 = uVar12;
          }
          iVar6 = mbedtls_x509_crt_is_revoked(crt,crl);
          if (iVar6 != 0) {
            uVar13 = uVar13 | 2;
            goto LAB_0012314e;
          }
          crl = crl->next;
          if (crl == (mbedtls_x509_crl *)0x0) goto LAB_0012314e;
        }
      }
LAB_0012314e:
      *puVar15 = *puVar15 | uVar13;
      local_160 = local_160 + 4;
      crt = pmVar11;
      path_cnt = uVar2;
      bVar16 = pmVar10 != (mbedtls_x509_crt *)0x0;
    } while( true );
  }
  iVar6 = -0x2800;
  goto LAB_001231f9;
LAB_00123183:
  iVar6 = -0x3000;
LAB_00123196:
  if ((bVar16) && (iVar6 = 0, uVar2 != 0)) {
    do {
      cur_flags = *local_160;
      if ((f_vrfy != (_func_int_void_ptr_mbedtls_x509_crt_ptr_int_uint32_t_ptr *)0x0) &&
         (iVar6 = (*f_vrfy)(p_vrfy,((x509_crt_verify_chain_item *)(local_160 + -2))->crt,
                            (int)path_cnt,&cur_flags), iVar6 != 0)) break;
      *flags = *flags | cur_flags;
      local_160 = local_160 + -4;
      bVar16 = path_cnt != 0;
      path_cnt = path_cnt - 1;
      iVar6 = 0;
    } while (bVar16);
  }
LAB_001231f9:
  iVar8 = -0x3000;
  if (iVar6 != -0x2700) {
    iVar8 = iVar6;
  }
  if (iVar8 == 0) {
    iVar8 = -0x2700;
    if (*flags == 0) {
      iVar8 = 0;
    }
  }
  else {
    *flags = 0xffffffff;
  }
  return iVar8;
}

Assistant:

int mbedtls_x509_crt_verify_with_profile( mbedtls_x509_crt *crt,
                     mbedtls_x509_crt *trust_ca,
                     mbedtls_x509_crl *ca_crl,
                     const mbedtls_x509_crt_profile *profile,
                     const char *cn, uint32_t *flags,
                     int (*f_vrfy)(void *, mbedtls_x509_crt *, int, uint32_t *),
                     void *p_vrfy )
{
    int ret;
    mbedtls_pk_type_t pk_type;
    x509_crt_verify_chain_item ver_chain[X509_MAX_VERIFY_CHAIN_SIZE];
    size_t chain_len;
    uint32_t *ee_flags = &ver_chain[0].flags;

    *flags = 0;
    memset( ver_chain, 0, sizeof( ver_chain ) );
    chain_len = 0;

    if( profile == NULL )
    {
        ret = MBEDTLS_ERR_X509_BAD_INPUT_DATA;
        goto exit;
    }

    /* check name if requested */
    if( cn != NULL )
        x509_crt_verify_name( crt, cn, ee_flags );

    /* Check the type and size of the key */
    pk_type = mbedtls_pk_get_type( &crt->pk );

    if( x509_profile_check_pk_alg( profile, pk_type ) != 0 )
        *ee_flags |= MBEDTLS_X509_BADCERT_BAD_PK;

    if( x509_profile_check_key( profile, &crt->pk ) != 0 )
        *ee_flags |= MBEDTLS_X509_BADCERT_BAD_KEY;

    /* Check the chain */
    ret = x509_crt_verify_chain( crt, trust_ca, ca_crl, profile,
                                 ver_chain, &chain_len );
    if( ret != 0 )
        goto exit;

    /* Build final flags, calling callback on the way if any */
    ret = x509_crt_merge_flags_with_cb( flags,
                                        ver_chain, chain_len, f_vrfy, p_vrfy );

exit:
    /* prevent misuse of the vrfy callback - VERIFY_FAILED would be ignored by
     * the SSL module for authmode optional, but non-zero return from the
     * callback means a fatal error so it shouldn't be ignored */
    if( ret == MBEDTLS_ERR_X509_CERT_VERIFY_FAILED )
        ret = MBEDTLS_ERR_X509_FATAL_ERROR;

    if( ret != 0 )
    {
        *flags = (uint32_t) -1;
        return( ret );
    }

    if( *flags != 0 )
        return( MBEDTLS_ERR_X509_CERT_VERIFY_FAILED );

    return( 0 );
}